

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall higan::TcpServer::OnNewConnection(TcpServer *this,int socket,InetAddress *address)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  LogLevel LVar1;
  TcpConnection *this_01;
  element_type *peVar2;
  undefined8 uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>,_bool>
  pVar4;
  code *local_488;
  undefined8 local_480;
  type local_478;
  EventLoopFunc local_458;
  _Base_ptr local_438;
  undefined1 local_430;
  pair<const_int,_std::shared_ptr<higan::TcpConnection>_> local_428;
  Fmt local_410;
  Logger local_310;
  TcpServer *local_f8;
  code *local_f0;
  undefined8 local_e8;
  type local_e0;
  TcpConnectionCallback local_c8;
  undefined1 local_a8 [8];
  TcpConnectionPtr connection_ptr;
  EventLoop *loop;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string connection_name;
  InetAddress *address_local;
  TcpServer *pTStack_10;
  int socket_local;
  TcpServer *this_local;
  
  connection_name.field_2._8_8_ = address;
  address_local._4_4_ = socket;
  pTStack_10 = this;
  std::operator+(&local_60,&this->server_name_,"-");
  InetAddress::GetIpPort_abi_cxx11_(&local_80,(InetAddress *)connection_name.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          EventLoopThreadPool::GetNextEventLoop(&this->thread_pool_);
  this_01 = (TcpConnection *)operator_new(0x210);
  TcpConnection::TcpConnection
            (this_01,(EventLoop *)
                     connection_ptr.
                     super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,(string *)local_40,address_local._4_4_,
             (InetAddress *)connection_name.field_2._8_8_);
  std::shared_ptr<higan::TcpConnection>::shared_ptr<higan::TcpConnection,void>
            ((shared_ptr<higan::TcpConnection> *)local_a8,this_01);
  peVar2 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
  TcpConnection::SetMessageCallback(peVar2,&this->message_callback_);
  peVar2 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
  local_f0 = OnConnectionError;
  local_e8 = 0;
  local_f8 = this;
  std::
  bind<void(higan::TcpServer::*)(std::shared_ptr<higan::TcpConnection>const&),higan::TcpServer*,std::_Placeholder<1>const&>
            (&local_e0,(offset_in_TcpServer_to_subr *)&local_f0,&local_f8,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<higan::TcpConnection>const&)>::
  function<std::_Bind<void(higan::TcpServer::*(higan::TcpServer*,std::_Placeholder<1>))(std::shared_ptr<higan::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<higan::TcpConnection>const&)> *)&local_c8,&local_e0);
  TcpConnection::SetErrorCallback(peVar2,&local_c8);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function(&local_c8);
  peVar2 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
  TcpConnection::SetNewConnectionCallback(peVar2,&this->newconnection_callback_);
  LVar1 = Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    Logger::Logger(&local_310,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpServer.cpp"
                   ,0x30,"OnNewConnection");
    uVar3 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_410,"a new connection: %s create",uVar3);
    Logger::operator<<(&local_310,&local_410);
    Logger::~Logger(&local_310);
  }
  std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>::
  pair<int_&,_std::shared_ptr<higan::TcpConnection>_&,_true>
            (&local_428,(int *)((long)&address_local + 4),
             (shared_ptr<higan::TcpConnection> *)local_a8);
  pVar4 = std::
          map<int,_std::shared_ptr<higan::TcpConnection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>_>
          ::insert(&this->connection_map_,&local_428);
  local_438 = (_Base_ptr)pVar4.first._M_node;
  local_430 = pVar4.second;
  std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>::~pair(&local_428);
  this_00 = connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_488 = TcpConnection::ConnectionEstablished;
  local_480 = 0;
  std::bind<void(higan::TcpConnection::*)(),std::shared_ptr<higan::TcpConnection>&>
            (&local_478,(offset_in_TcpConnection_to_subr *)&local_488,
             (shared_ptr<higan::TcpConnection> *)local_a8);
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>,void>
            ((function<void()> *)&local_458,&local_478);
  EventLoop::RunInLoop((EventLoop *)this_00._M_pi,&local_458);
  std::function<void_()>::~function(&local_458);
  std::_Bind<void_(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>::~_Bind
            (&local_478);
  std::shared_ptr<higan::TcpConnection>::~shared_ptr((shared_ptr<higan::TcpConnection> *)local_a8);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void TcpServer::OnNewConnection(int socket, const InetAddress& address)
{
	std::string connection_name = server_name_ + "-" + address.GetIpPort();

	EventLoop* loop = thread_pool_.GetNextEventLoop();

	TcpConnectionPtr connection_ptr(
			new TcpConnection(loop, connection_name, socket, address));

	connection_ptr->SetMessageCallback(message_callback_);
	connection_ptr->SetErrorCallback(std::bind(&TcpServer::OnConnectionError, this, _1));
	connection_ptr->SetNewConnectionCallback(newconnection_callback_);

	LOG_INFO << higan::Fmt("a new connection: %s create", connection_name.c_str());
	connection_map_.insert({socket, connection_ptr});

	/**
	 * 在新连接所属的loop中执行
	 * 这里因为是主线程运行, 所以ConnectionEstablished会被放入从线程的队列中
	 * 等待从线程执行
	 */
	loop->RunInLoop(std::bind(&TcpConnection::ConnectionEstablished, connection_ptr));
}